

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maker.h
# Opt level: O1

void __thiscall
bwt::PasswordMaker::PasswordMaker(PasswordMaker *this,string *configFileName,size_t threadNumber)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  logger *this_00;
  color_mode local_a4;
  long *local_a0;
  long local_98;
  long local_90 [2];
  string local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  *local_58;
  string local_50;
  
  *(undefined8 *)((long)&(this->_serialLock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_serialLock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_serialLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_serialLock).super___mutex_base._M_mutex + 8) = 0;
  (this->_serialLock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_60 = &(this->_serialFileName).field_2;
  (this->_serialFileName)._M_dataplus._M_p = (pointer)local_60;
  (this->_serialFileName)._M_string_length = 0;
  (this->_serialFileName).field_2._M_local_buf[0] = '\0';
  ::std::operator+(&this->_configFileName,"./config/",configFileName);
  (this->_configuration).m_type = null;
  (this->_configuration).m_value.object = (object_t *)0x0;
  local_a0 = local_90;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Main","");
  local_a4 = automatic;
  paVar1 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,local_a0,local_98 + (long)local_a0);
  spdlog::synchronous_factory::
  create<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>,spdlog::color_mode&>
            ((synchronous_factory *)&this->_mainLogger,&local_80,&local_a4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  local_a0 = local_90;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Worker","");
  local_a4 = automatic;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,local_a0,local_98 + (long)local_a0);
  spdlog::synchronous_factory::
  create<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>,spdlog::color_mode&>
            ((synchronous_factory *)&this->_workerLogger,&local_80,&local_a4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  local_58 = &(this->_threadPool).tasks;
  *(_Elt_pointer *)
   ((long)&(this->_threadPool).tasks.c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_finish + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->_threadPool).tasks.c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_finish + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->_threadPool).tasks.c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_start + 0x18) = (_Map_pointer)0x0;
  (this->_threadPool).tasks.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->_threadPool).tasks.c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_start + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->_threadPool).tasks.c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_start + 0x10) = (_Elt_pointer)0x0;
  (this->_threadPool).tasks.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->_threadPool).tasks.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->_threadPool).workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_threadPool).tasks.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->_threadPool).workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_threadPool).workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->_threadPool).tasks.c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_finish + 0x18) = (_Map_pointer)0x0;
  std::_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_initialize_map((_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *
                    )local_58,0);
  *(undefined8 *)((long)&(this->_threadPool).queue_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->_threadPool).queue_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_threadPool).queue_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_threadPool).queue_mutex.super___mutex_base._M_mutex + 8) = 0;
  (this->_threadPool).queue_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  ::std::condition_variable::condition_variable(&(this->_threadPool).condition);
  (this->_threadPool).stop = false;
  if (threadNumber != 0) {
    do {
      local_80._M_dataplus._M_p = (pointer)&this->_threadPool;
      ::std::vector<std::thread,std::allocator<std::thread>>::
      emplace_back<ThreadPool::ThreadPool(unsigned_long)::_lambda()_1_>
                ((vector<std::thread,std::allocator<std::thread>> *)&this->_threadPool,
                 (anon_class_8_1_8991fb9c_for__M_head_impl *)&local_80);
      threadNumber = threadNumber - 1;
    } while (threadNumber != 0);
  }
  this_00 = (this->_workerLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"[%Y-%m-%d %H:%M:%S.%e] [%n] [%^%l%$] [id:%6t] %v","");
  spdlog::logger::set_pattern(this_00,&local_50,local);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

PasswordMaker(const std::string& configFileName, const std::size_t threadNumber = std::thread::hardware_concurrency()) :
		_configFileName(CONFIG_PATH + configFileName),
		_threadPool(threadNumber) {
		_workerLogger->set_pattern("[%Y-%m-%d %H:%M:%S.%e] [%n] [%^%l%$] [id:%6t] %v");
	}